

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndirectTest.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::IndirectDraw::iterate
          (TestStatus *__return_storage_ptr__,IndirectDraw *this)

{
  VkPrimitiveTopology VVar1;
  Context *this_00;
  TestLog *pTVar2;
  DeviceInterface *pDVar3;
  Allocation *pAVar4;
  pointer __dest;
  Buffer *pBVar5;
  Image *this_01;
  VkQueue pVVar6;
  TestStatus *pTVar7;
  bool bVar8;
  VkResult VVar9;
  VkDevice pVVar10;
  Allocator *pAVar11;
  long lVar12;
  char *__s;
  TestError *this_02;
  uint uVar13;
  int iVar14;
  int y;
  VkDrawIndirectCommand *command;
  VkDrawIndexedIndirectCommand *command_00;
  VkDrawIndirectCommand *command_01;
  VkDrawIndexedIndirectCommand *command_02;
  size_t __n;
  int x;
  int x_00;
  VkDrawIndirectCommand *command_03;
  VkDrawIndexedIndirectCommand *command_04;
  int iVar15;
  double dVar16;
  double dVar17;
  deUint32 dVar18;
  allocator<char> local_169;
  VkQueue local_168;
  undefined8 local_160;
  undefined4 local_158;
  TestStatus *local_150;
  TestLog *local_148;
  double local_140;
  double local_138;
  double local_130;
  Texture2D referenceFrame;
  ConstPixelBufferAccess renderedFrame;
  string local_a8 [32];
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_DrawTestsBaseClass).super_TestInstance.m_context;
  pTVar2 = this_00->m_testCtx->m_log;
  local_168 = Context::getUniversalQueue(this_00);
  if (this->m_drawType == DRAW_TYPE_INDEXED) {
    VVar1 = (this->super_DrawTestsBaseClass).m_topology;
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      command_04 = (VkDrawIndexedIndirectCommand *)&DAT_009a9c08;
      command_02 = (VkDrawIndexedIndirectCommand *)&DAT_009a9bf4;
      command_00 = (VkDrawIndexedIndirectCommand *)&DAT_009a9be0;
    }
    else {
      if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x14d);
        goto LAB_00687897;
      }
      command_04 = (VkDrawIndexedIndirectCommand *)&DAT_009a9c48;
      command_02 = (VkDrawIndexedIndirectCommand *)&DAT_009a9c34;
      command_00 = (VkDrawIndexedIndirectCommand *)&DAT_009a9c20;
    }
    addCommand<vk::VkDrawIndexedIndirectCommand>(this,command_00);
    addCommand<vk::VkDrawIndexedIndirectCommand>(this,command_02);
    addCommand<vk::VkDrawIndexedIndirectCommand>(this,command_04);
    dVar18 = 0x28;
LAB_00687233:
    this->m_strideInBuffer = dVar18;
  }
  else if (this->m_drawType == DRAW_TYPE_SEQUENTIAL) {
    VVar1 = (this->super_DrawTestsBaseClass).m_topology;
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      command_03 = (VkDrawIndirectCommand *)&DAT_009a9ba0;
      command_01 = (VkDrawIndirectCommand *)&DAT_009a9b90;
      command = (VkDrawIndirectCommand *)&DAT_009a9b80;
    }
    else {
      if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x111);
        goto LAB_00687897;
      }
      command_03 = (VkDrawIndirectCommand *)&DAT_009a9bd0;
      command_01 = (VkDrawIndirectCommand *)&DAT_009a9bc0;
      command = (VkDrawIndirectCommand *)&DAT_009a9bb0;
    }
    addCommand<vk::VkDrawIndirectCommand>(this,command);
    addCommand<vk::VkDrawIndirectCommand>(this,command_01);
    addCommand<vk::VkDrawIndirectCommand>(this,command_03);
    dVar18 = 0x20;
    goto LAB_00687233;
  }
  this->m_drawCount = 2;
  this->m_offsetInBuffer = 8;
  local_150 = __return_storage_ptr__;
  DrawTestsBaseClass::beginRenderPass(&this->super_DrawTestsBaseClass);
  vertexBuffer.m_internal =
       (((this->super_DrawTestsBaseClass).m_vertexBuffer.m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x58])
            (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0);
  __n = (long)(this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  pVVar10 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&referenceFrame,this->m_offsetInBuffer + __n,0x100,
             VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar11 = Context::getDefaultAllocator
                      ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&submitInfo,pDVar3,pVVar10,(VkBufferCreateInfo *)&referenceFrame,pAVar11,
             (MemoryRequirement)0x1);
  local_148 = pTVar2;
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&this->m_indirectBuffer,(SharedPtr<vkt::Draw::Buffer> *)&submitInfo);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)&submitInfo);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&referenceFrame.m_width);
  pAVar4 = (((this->m_indirectBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00bf5e28;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar4->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar4->m_offset;
  __dest = (pointer)pAVar4->m_hostPtr;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest;
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  memcpy(__dest,&this->m_junkData,this->m_offsetInBuffer);
  memcpy((void *)((long)&__dest->m_ptr + this->m_offsetInBuffer),
         (this->m_indirectBufferContents).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start,__n);
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  pVVar10 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  pBVar5 = (this->m_indirectBuffer).m_ptr;
  pAVar4 = (pBVar5->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00bf5e28;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar4->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar4->m_offset;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pAVar4->m_hostPtr;
  pAVar4 = (pBVar5->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo._0_8_ = &PTR__Allocation_00bf5e28;
  submitInfo.pNext = (void *)(pAVar4->m_memory).m_internal;
  submitInfo._16_8_ = pAVar4->m_offset;
  submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar4->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (pDVar3,pVVar10,
             (VkDeviceMemory)
             referenceFrame.super_TextureLevelPyramid.m_data.
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,submitInfo._16_8_,
             __n + this->m_offsetInBuffer);
  ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4c])
            (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawTestsBaseClass).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  if (this->m_drawType == DRAW_TYPE_INDEXED) {
    pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
    (*pDVar3->_vptr_DeviceInterface[0x57])
              (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->m_indexBuffer).m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0);
  }
  if ((this->m_isMultiDrawEnabled == 0) || (this->m_drawIndirectMaxCount < this->m_drawCount)) {
    for (uVar13 = 0; uVar13 < this->m_drawCount; uVar13 = uVar13 + 1) {
      lVar12 = 0x2d8;
      if (this->m_drawType != DRAW_TYPE_SEQUENTIAL) {
        if (this->m_drawType != DRAW_TYPE_INDEXED) {
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,"impossible",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                     ,0x193);
          goto LAB_00687897;
        }
        lVar12 = 0x2e0;
      }
      pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
      (**(code **)((long)pDVar3->_vptr_DeviceInterface + lVar12))
                (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (((this->m_indirectBuffer).m_ptr)->m_object).
                 super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                 (ulong)(this->m_strideInBuffer * uVar13) + this->m_offsetInBuffer,1,0);
    }
  }
  else {
    lVar12 = 0x2d8;
    if (this->m_drawType != DRAW_TYPE_SEQUENTIAL) {
      if (this->m_drawType != DRAW_TYPE_INDEXED) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x183);
LAB_00687897:
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      lVar12 = 0x2e0;
    }
    pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
    (**(code **)((long)pDVar3->_vptr_DeviceInterface + lVar12))
              (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->m_indirectBuffer).m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               this->m_offsetInBuffer,this->m_drawCount,this->m_strideInBuffer);
  }
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x76])
            (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4a])
            (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pVVar6 = local_168;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&(this->super_DrawTestsBaseClass).m_cmdBuffer;
  VVar9 = (*pDVar3->_vptr_DeviceInterface[2])(pDVar3,local_168,1);
  ::vk::checkResult(VVar9,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x1a6);
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  VVar9 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,pVVar6);
  ::vk::checkResult(VVar9,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x1a8);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DrawTestsBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x100,0x100);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  local_140 = (double)referenceFrame.m_height * 0.5;
  dVar16 = (double)referenceFrame.m_width * 0.5;
  y = 0;
  iVar14 = referenceFrame.m_width;
  if (referenceFrame.m_width < 1) {
    iVar14 = 0;
  }
  iVar15 = referenceFrame.m_height;
  if (referenceFrame.m_height < 1) {
    iVar15 = 0;
  }
  local_138 = dVar16;
  for (; y != iVar15; y = y + 1) {
    dVar17 = (double)ABS((float)((double)y / local_140) + -1.0);
    local_130 = dVar17;
    for (x_00 = 0; iVar14 != x_00; x_00 = x_00 + 1) {
      if ((dVar17 <= 0.3) && (ABS((float)((double)x_00 / dVar16) + -1.0) <= 0.3)) {
        renderedFrame.m_format.order = R;
        renderedFrame.m_format.type = SNORM_INT8;
        renderedFrame.m_size.m_data._0_8_ = &DAT_3f8000003f800000;
        tcu::PixelBufferAccess::setPixel
                  (referenceFrame.super_TextureLevelPyramid.m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x_00,y,0);
        dVar16 = local_138;
        dVar17 = local_130;
      }
    }
  }
  this_01 = (this->super_DrawTestsBaseClass).m_colorTargetImage.m_ptr;
  pAVar11 = Context::getDefaultAllocator
                      ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  local_158 = 0;
  local_160 = 0;
  Image::readSurface(&renderedFrame,this_01,local_168,pAVar11,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar8 = tcu::fuzzyCompare(local_148,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  __s = qpGetTestResultName((uint)!bVar8);
  std::__cxx11::string::string<std::allocator<char>>(local_a8,__s,&local_169);
  pTVar7 = local_150;
  local_150->m_code = (uint)!bVar8;
  std::__cxx11::string::string((string *)&local_150->m_description,local_a8);
  std::__cxx11::string::~string(local_a8);
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar7;
}

Assistant:

tcu::TestStatus IndirectDraw::iterate (void)
{
	tcu::TestLog &log = m_context.getTestContext().getLog();
	const vk::VkQueue queue = m_context.getUniversalQueue();

	if (m_drawType == DRAW_TYPE_SEQUENTIAL)
	{
		switch (m_topology)
		{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		{
			vk::VkDrawIndirectCommand drawCommands[] =
			{
				{
					3,		//vertexCount
					1,		//instanceCount
					2,		//firstVertex
					0		//firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 }, // junk (stride)
				{
					3,		//vertexCount
					1,		//instanceCount
					5,		//firstVertex
					0		//firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			vk::VkDrawIndirectCommand drawCommands[] =
			{
				{
					4,		//vertexCount
					1,		//instanceCount
					2,		//firstVertex
					0		//firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 }, // junk (stride)
				{
					4,		//vertexCount
					1,		//instanceCount
					6,		//firstVertex
					0		//firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		default:
			TCU_FAIL("impossible");
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndirectCommand);
	}
	else if (m_drawType == DRAW_TYPE_INDEXED)
	{
		switch (m_topology)
		{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		{
			vk::VkDrawIndexedIndirectCommand drawCommands[] =
			{
				{
					3,					// indexCount
					1,					// instanceCount
					2,					// firstIndex
					VERTEX_OFFSET,		// vertexOffset
					0,					// firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 }, // junk (stride)
				{
					3,					// indexCount
					1,					// instanceCount
					5,					// firstIndex
					VERTEX_OFFSET,		// vertexOffset
					0,					// firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			vk::VkDrawIndexedIndirectCommand drawCommands[] =
			{
				{
					4,				// indexCount
					1,				// instanceCount
					2,				// firstIndex
					VERTEX_OFFSET,	// vertexOffset
					0,				// firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 }, // junk (stride)
				{
					4,				// indexCount
					1,				// instanceCount
					6,				// firstIndex
					VERTEX_OFFSET,	// vertexOffset
					0,				// firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		default:
			TCU_FAIL("impossible");
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndexedIndirectCommand);
	}

	m_drawCount			= 2;
	m_offsetInBuffer	= sizeof(m_junkData);

	beginRenderPass();

	const vk::VkDeviceSize vertexBufferOffset	= 0;
	const vk::VkBuffer vertexBuffer				= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	const vk::VkDeviceSize dataSize = m_indirectBufferContents.size();

	m_indirectBuffer = Buffer::createAndAlloc(	m_vk,
												m_context.getDevice(),
												BufferCreateInfo(dataSize + m_offsetInBuffer,
																 vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT),
												m_context.getDefaultAllocator(),
												vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indirectBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_junkData, static_cast<size_t>(m_offsetInBuffer));
	deMemcpy(ptr + m_offsetInBuffer, &m_indirectBufferContents[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk,
							   m_context.getDevice(),
							   m_indirectBuffer->getBoundMemory().getMemory(),
							   m_indirectBuffer->getBoundMemory().getOffset(),
							   dataSize + m_offsetInBuffer);

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	if (m_drawType == DRAW_TYPE_INDEXED)
	{
		m_vk.cmdBindIndexBuffer(*m_cmdBuffer, m_indexBuffer->object(), DE_NULL, vk::VK_INDEX_TYPE_UINT32);
	}

	if (m_isMultiDrawEnabled && m_drawCount <= m_drawIndirectMaxCount)
	{
		switch (m_drawType)
		{
			case DRAW_TYPE_SEQUENTIAL:
				m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			case DRAW_TYPE_INDEXED:
				m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			default:
				TCU_FAIL("impossible");
		}
	}
	else
	{
		for (deUint32 drawNdx = 0; drawNdx < m_drawCount; drawNdx++)
		{
			switch (m_drawType)
			{
				case DRAW_TYPE_SEQUENTIAL:
					m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				case DRAW_TYPE_INDEXED:
					m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				default:
					TCU_FAIL("impossible");
			}
		}
	}
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageCoordinates refCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refCoords.bottom	&&
				 yCoord <= refCoords.top	&&
				 xCoord >= refCoords.left	&&
				 xCoord <= refCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset					= { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

}